

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O2

char * helicsFilterGetPropertyString(HelicsFilter filt,char *prop)

{
  long *plVar1;
  size_t sVar2;
  char *pcVar3;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar3 = "";
  if (((filt != (HelicsFilter)0x0) && (prop != (char *)0x0)) &&
     (*(int *)((long)filt + 4) == -0x13d9fed9)) {
    plVar1 = *(long **)((long)filt + 8);
    sVar2 = strlen(prop);
    (**(code **)(*plVar1 + 0x38))(&local_40,plVar1,sVar2,prop);
    if (local_40._M_string_length == 0) {
      pcVar3 = "";
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)filt + 0x38),&local_40);
      pcVar3 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)filt + 0x38))->_M_dataplus)._M_p;
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return pcVar3;
}

Assistant:

const char* helicsFilterGetPropertyString(HelicsFilter filt, const char* prop)
{
    static constexpr char nullStr[] = "";
    auto* fObj = getFilterObj(filt, nullptr);
    if (fObj == nullptr || prop == nullptr) {
        return nullStr;
    }
    try {
        auto res = fObj->filtPtr->getString(prop);
        if (res.empty()) {
            return nullStr;
        }
        fObj->buffer = res;
        return fObj->buffer.c_str();
    }
    catch (...) {
        return nullStr;
    }
}